

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DivideTest.h
# Opt level: O0

void __thiscall
DivideTest<long>::test_one<(libdivide::Branching)1>
          (DivideTest<long> *this,long numer,long denom,
          divider<long,_(libdivide::Branching)1> *the_divider)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  ulong *in_RCX;
  long in_RDX;
  ulong in_RSI;
  long result;
  long expect;
  uint64_t q_sign;
  uint64_t is_power_of_2;
  int64_t q;
  int64_t magic;
  int64_t sign;
  uint8_t shift;
  uint8_t more;
  __int128_t rl;
  __int128_t yl;
  __int128_t xl;
  DivideTest<long> *in_stack_fffffffffffffee8;
  string local_108 [32];
  long local_e8;
  long local_e0;
  ulong *local_d8;
  long local_d0;
  ulong local_c8;
  ulong *local_b8;
  ulong local_b0;
  ulong local_a8;
  ulong *local_a0;
  ulong local_98;
  ulong *local_90;
  ulong local_88;
  ulong local_80;
  long local_78;
  ulong local_70;
  ulong local_68;
  byte local_5a;
  byte local_59;
  ulong *local_58;
  ulong local_50;
  undefined8 local_48;
  long local_40;
  ulong local_38;
  long local_30;
  ulong local_28;
  long local_20;
  ulong local_10;
  ulong local_8;
  
  local_d8 = in_RCX;
  local_d0 = in_RDX;
  local_c8 = in_RSI;
  uVar3 = std::numeric_limits<long>::min();
  if ((in_RSI != uVar3) || (local_d0 != -1)) {
    local_e0 = (long)local_c8 / local_d0;
    local_b0 = local_c8;
    local_b8 = local_d8;
    local_a0 = local_d8;
    local_a8 = local_c8;
    local_90 = local_d8;
    local_98 = local_c8;
    local_50 = local_c8;
    local_58 = local_d8;
    local_59 = (byte)local_d8[1];
    local_5a = local_59 & 0x3f;
    local_68 = (ulong)((int)(char)local_59 >> 7);
    local_70 = *local_d8;
    local_8 = local_c8;
    local_20 = (long)local_c8 >> 0x3f;
    local_28 = local_c8;
    local_30 = (long)local_70 >> 0x3f;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_c8;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = local_70;
    local_48 = SUB168(auVar1 * auVar2,0);
    local_40 = SUB168(auVar1 * auVar2,8) + local_c8 * local_30 + local_20 * local_70;
    local_80 = (ulong)(local_70 == 0);
    local_88 = (long)(local_c8 + local_40) >> 0x3f;
    local_e8 = ((long)((local_88 & (1L << local_5a) - local_80) + local_c8 + local_40) >> local_5a ^
               local_68) - local_68;
    if (local_e8 != local_e0) {
      local_78 = local_e8;
      local_38 = local_70;
      local_10 = local_70;
      std::operator<<((ostream *)&std::cerr,"Failure for ");
      testcase_name_abi_cxx11_(in_stack_fffffffffffffee8,(int)(in_RSI >> 0x20));
      std::operator<<((ostream *)&std::cerr,local_108);
      std::__cxx11::string::~string(local_108);
      std::operator<<((ostream *)&std::cerr,": ");
      std::ostream::operator<<((ostream *)&std::cerr,local_c8);
      std::operator<<((ostream *)&std::cerr," / ");
      std::ostream::operator<<((ostream *)&std::cerr,local_d0);
      std::operator<<((ostream *)&std::cerr," = ");
      std::ostream::operator<<((ostream *)&std::cerr,local_e0);
      std::operator<<((ostream *)&std::cerr,", but got ");
      std::ostream::operator<<((ostream *)&std::cerr,local_e8);
      std::operator<<((ostream *)&std::cerr,"\n");
      exit(1);
    }
  }
  return;
}

Assistant:

void test_one(T numer, T denom, const divider<T, ALGO> &the_divider) {
        // Don't crash with INT_MIN / -1
        // INT_MIN / -1 is undefined behavior in C/C++
        if (limits::is_signed && numer == (limits::min)() && denom == T(-1)) {
            return;
        }

        T expect = numer / denom;
        T result = numer / the_divider;

        if (result != expect) {
            PRINT_ERROR(F("Failure for "));
            PRINT_ERROR(testcase_name(ALGO));
            PRINT_ERROR(F(": "));
            PRINT_ERROR(numer);
            PRINT_ERROR(F(" / "));
            PRINT_ERROR(denom);
            PRINT_ERROR(F(" = "));
            PRINT_ERROR(expect);
            PRINT_ERROR(F(", but got "));
            PRINT_ERROR(result);
            PRINT_ERROR(F("\n"));
            TEST_FAIL();
        }
    }